

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O2

string * __thiscall
pbrt::SceneEntity::ToString_abi_cxx11_(string *__return_storage_ptr__,SceneEntity *this)

{
  FileLoc *in_R9;
  
  StringPrintf<std::__cxx11::string_const&,pbrt::ParameterDictionary_const&,pbrt::FileLoc_const&>
            (__return_storage_ptr__,(pbrt *)"[ SceneEntity name: %s parameters: %s loc: %s ]",
             (char *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->parameters,
             (ParameterDictionary *)&this->loc,in_R9);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const {
        return StringPrintf("[ SceneEntity name: %s parameters: %s loc: %s ]", name,
                            parameters, loc);
    }